

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O3

string * __thiscall
flatbuffers::ts::TsGenerator::GenType_abi_cxx11_
          (string *__return_storage_ptr__,TsGenerator *this,Type *type)

{
  Parser *pPVar1;
  string *psVar2;
  undefined8 uVar3;
  pointer pcVar4;
  char *pcVar5;
  char *pcVar6;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined2 uStack_18;
  undefined2 uStack_16;
  undefined4 uStack_14;
  ushort uStack_10;
  undefined6 uStack_e;
  
  switch(*(undefined4 *)&(this->super_BaseGenerator)._vptr_BaseGenerator) {
  case 1:
    psVar2 = (this->super_BaseGenerator).path_;
    if ((psVar2 == (string *)0x0) || (*(int *)&psVar2[6].field_2 == 1)) {
      local_28 = 4;
      uStack_24 = 0;
      uStack_20 = 0;
      uStack_1c = 0;
      uStack_18 = 0;
      uStack_16 = 0;
      uStack_14 = 0;
      uStack_10 = 0;
    }
    else {
      uVar3 = *(undefined8 *)((long)&psVar2[6].field_2 + 8);
      pcVar4 = psVar2[7]._M_dataplus._M_p;
      uStack_18 = SUB82(pcVar4,0);
      uStack_16 = (undefined2)((ulong)pcVar4 >> 0x10);
      uStack_14 = (undefined4)((ulong)pcVar4 >> 0x20);
      uStack_10 = (ushort)psVar2[7]._M_string_length;
      uStack_e = (undefined6)(psVar2[7]._M_string_length >> 0x10);
      local_28 = (undefined4)psVar2[6].field_2._M_allocated_capacity;
      uStack_24 = (undefined4)(psVar2[6].field_2._M_allocated_capacity >> 0x20);
      uStack_20 = (undefined4)uVar3;
      uStack_1c = (undefined4)((ulong)uVar3 >> 0x20);
    }
    goto LAB_0025cb1e;
  case 2:
  case 3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "Int8";
    pcVar5 = "";
    break;
  case 4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "Uint8";
    pcVar5 = "";
    break;
  case 5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "Int16";
    pcVar5 = "";
    break;
  case 6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "Uint16";
    pcVar5 = "";
    break;
  case 7:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "Int32";
    pcVar5 = "";
    break;
  case 8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "Uint32";
    pcVar5 = "";
    break;
  case 9:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "Int64";
    pcVar5 = "";
    break;
  case 10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "Uint64";
    pcVar5 = "";
    break;
  case 0xb:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "Float32";
    pcVar5 = "";
    break;
  case 0xc:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "Float64";
    pcVar5 = "";
    break;
  case 0xd:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "String";
    pcVar5 = "";
    break;
  case 0xe:
    local_28 = *(undefined4 *)((long)&(this->super_BaseGenerator)._vptr_BaseGenerator + 4);
    uStack_10 = *(ushort *)&(this->super_BaseGenerator).file_name_;
    type = (Type *)(ulong)uStack_10;
    uStack_24 = 0;
    pPVar1 = (this->super_BaseGenerator).parser_;
    psVar2 = (this->super_BaseGenerator).path_;
    uStack_20 = SUB84(pPVar1,0);
    uStack_1c = (undefined4)((ulong)pPVar1 >> 0x20);
    uStack_18 = SUB82(psVar2,0);
    uStack_16 = (undefined2)((ulong)psVar2 >> 0x10);
    uStack_14 = (undefined4)((ulong)psVar2 >> 0x20);
LAB_0025cb1e:
    GenType_abi_cxx11_(__return_storage_ptr__,(TsGenerator *)&stack0xffffffffffffffd8,type);
    return __return_storage_ptr__;
  case 0xf:
    pPVar1 = (this->super_BaseGenerator).parser_;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = (pPVar1->super_ParserState).prev_cursor_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar5,
               (pPVar1->super_ParserState).cursor_ + (long)pcVar5);
    return __return_storage_ptr__;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "flatbuffers.Table";
    pcVar5 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar6,pcVar5);
  return __return_storage_ptr__;
}

Assistant:

static std::string GenType(const Type &type) {
    switch (type.base_type) {
      case BASE_TYPE_BOOL:
      case BASE_TYPE_CHAR: return "Int8";
      case BASE_TYPE_UTYPE: return GenType(GetUnionUnderlyingType(type));
      case BASE_TYPE_UCHAR: return "Uint8";
      case BASE_TYPE_SHORT: return "Int16";
      case BASE_TYPE_USHORT: return "Uint16";
      case BASE_TYPE_INT: return "Int32";
      case BASE_TYPE_UINT: return "Uint32";
      case BASE_TYPE_LONG: return "Int64";
      case BASE_TYPE_ULONG: return "Uint64";
      case BASE_TYPE_FLOAT: return "Float32";
      case BASE_TYPE_DOUBLE: return "Float64";
      case BASE_TYPE_STRING: return "String";
      case BASE_TYPE_VECTOR: return GenType(type.VectorType());
      case BASE_TYPE_STRUCT: return type.struct_def->name;
      default: return "flatbuffers.Table";
    }
  }